

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O2

void __thiscall google::CapturedStream::CapturedStream(CapturedStream *this,int fd,string *filename)

{
  this->fd_ = fd;
  (this->uncaptured_fd_).fd_ = -1;
  std::__cxx11::string::string((string *)&this->filename_,(string *)filename);
  Capture(this);
  return;
}

Assistant:

CapturedStream(int fd, string filename)
      : fd_(fd), filename_(std::move(filename)) {
    Capture();
  }